

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_mwait_x86_64(CPUX86State *env,int next_eip_addend)

{
  CPUState *pCVar1;
  ArchCPU *cpu_00;
  uintptr_t unaff_retaddr;
  X86CPU *cpu;
  CPUState *cs;
  int next_eip_addend_local;
  CPUX86State *env_local;
  
  pCVar1 = env_cpu(env);
  cpu_00 = env_archcpu(env);
  if ((int)env->regs[1] == 0) {
    cpu_svm_check_intercept_param_x86_64(env,0x8b,0,unaff_retaddr);
    env->eip = (long)next_eip_addend + env->eip;
    if (pCVar1->cpu_index == 0) {
      do_hlt(cpu_00);
    }
    return;
  }
  raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
}

Assistant:

void helper_mwait(CPUX86State *env, int next_eip_addend)
{
    CPUState *cs = env_cpu(env);
    X86CPU *cpu = env_archcpu(env);

    if ((uint32_t)env->regs[R_ECX] != 0) {
        raise_exception_ra(env, EXCP0D_GPF, GETPC());
    }

    cpu_svm_check_intercept_param(env, SVM_EXIT_MWAIT, 0, GETPC());
    env->eip += next_eip_addend;

    /* XXX: not complete but not completely erroneous */
    // if (cs->cpu_index != 0 || CPU_NEXT(cs) != NULL) { // TODO
    if (cs->cpu_index != 0) {
        // do_pause(cpu);
    } else {
        do_hlt(cpu);
    }
}